

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  ReadableDirectory *dir;
  PathPtr path;
  PathPtr path_00;
  String *pSVar1;
  size_t sVar2;
  Impl *pIVar3;
  StringPtr path_01;
  Path local_68;
  ArrayPtr<const_kj::String> local_48;
  PathPtr local_38;
  
  path_01.content.size_ = embedPath.content.size_;
  if ((path_01.content.size_ == 1) || (*embedPath.content.ptr != '/')) {
    dir = this->sourceDir;
    local_38.parts.ptr = (this->path).parts.ptr;
    local_38.parts.size_ = (this->path).parts.size_;
    local_48 = (ArrayPtr<const_kj::String>)kj::PathPtr::parent(&local_38);
    pIVar3 = (Impl *)&local_48;
    kj::PathPtr::eval(&local_68,(PathPtr *)pIVar3,embedPath);
    path_00.parts.size_ = local_68.parts.size_;
    path_00.parts.ptr = local_68.parts.ptr;
    Impl::readEmbed(__return_storage_ptr__,pIVar3,dir,path_00);
    sVar2 = local_68.parts.size_;
    pSVar1 = local_68.parts.ptr;
    if (local_68.parts.ptr != (String *)0x0) {
      local_68.parts.ptr = (String *)0x0;
      local_68.parts.size_ = 0;
      (**(local_68.parts.disposer)->_vptr_ArrayDisposer)
                (local_68.parts.disposer,pSVar1,0x18,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  else {
    pIVar3 = this->loader;
    path_01.content.ptr = (char *)(path_01.content.size_ - 1);
    kj::Path::parse(&local_68,(Path *)(embedPath.content.ptr + 1),path_01);
    path.parts.size_ = local_68.parts.size_;
    path.parts.ptr = local_68.parts.ptr;
    Impl::readEmbedFromSearchPath(__return_storage_ptr__,pIVar3,path);
    sVar2 = local_68.parts.size_;
    pSVar1 = local_68.parts.ptr;
    if (local_68.parts.ptr != (String *)0x0) {
      local_68.parts.ptr = (String *)0x0;
      local_68.parts.size_ = 0;
      (**(local_68.parts.disposer)->_vptr_ArrayDisposer)
                (local_68.parts.disposer,pSVar1,0x18,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    if (embedPath.size() > 0 && embedPath[0] == '/') {
      return loader.readEmbedFromSearchPath(kj::Path::parse(embedPath.slice(1)));
    } else {
      return loader.readEmbed(sourceDir, path.parent().eval(embedPath));
    }
  }